

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_film_grain_params(AV1_COMP *cpi,aom_write_bit_buffer *wb)

{
  long lVar1;
  int iVar2;
  int iVar3;
  aom_write_bit_buffer *in_RSI;
  long in_RDI;
  int i_5;
  int i_4;
  int i_3;
  int num_pos_chroma;
  int num_pos_luma;
  int i_2;
  int i_1;
  int i;
  RefCntBuffer *buf;
  int ref_idx;
  int ref_frame;
  aom_film_grain_t *pars;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffbc;
  int local_3c;
  int local_38;
  int local_34;
  int local_24;
  
  lVar1 = *(long *)(in_RDI + 0x3c068);
  aom_wb_write_bit(in_RSI,*(int *)(lVar1 + 0x23c));
  if (*(int *)(lVar1 + 0x23c) != 0) {
    aom_wb_write_literal
              ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
               ,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    if ((((AV1_COMMON *)(in_RDI + 0x3bf80))->current_frame).frame_type == '\x01') {
      aom_wb_write_bit(in_RSI,*(int *)(lVar1 + 0x240));
    }
    if (*(int *)(lVar1 + 0x240) == 0) {
      local_24 = 1;
      while ((local_24 < 8 &&
             ((iVar2 = get_ref_frame_map_idx
                                 ((AV1_COMMON *)(in_RDI + 0x3bf80),(MV_REFERENCE_FRAME)local_24),
              *(char *)(*(long *)(in_RDI + 0x3c120 + (long)iVar2 * 8) + 0x238) == '\0' ||
              (iVar2 = aom_check_grain_params_equiv
                                 ((aom_film_grain_t *)
                                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                  (aom_film_grain_t *)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
              iVar2 == 0))))) {
        local_24 = local_24 + 1;
      }
      aom_wb_write_literal
                ((aom_write_bit_buffer *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    }
    else {
      aom_wb_write_literal
                ((aom_write_bit_buffer *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      for (local_34 = 0; local_34 < *(int *)(lVar1 + 0x2b4); local_34 = local_34 + 1) {
        aom_wb_write_literal
                  ((aom_write_bit_buffer *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        aom_wb_write_literal
                  ((aom_write_bit_buffer *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      }
      if (*(char *)(*(long *)(in_RDI + 0x42008) + 0x4d) == '\0') {
        aom_wb_write_bit(in_RSI,*(int *)(lVar1 + 0x4b8));
      }
      if (((*(char *)(*(long *)(in_RDI + 0x42008) + 0x4d) == '\0') && (*(int *)(lVar1 + 0x4b8) == 0)
          ) && ((*(int *)(*(long *)(in_RDI + 0x42008) + 0x60) != 1 ||
                ((*(int *)(*(long *)(in_RDI + 0x42008) + 100) != 1 || (*(int *)(lVar1 + 0x2b4) != 0)
                 ))))) {
        aom_wb_write_literal
                  ((aom_write_bit_buffer *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        for (local_38 = 0; local_38 < *(int *)(lVar1 + 0x308); local_38 = local_38 + 1) {
          aom_wb_write_literal
                    ((aom_write_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          aom_wb_write_literal
                    ((aom_write_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        }
        aom_wb_write_literal
                  ((aom_write_bit_buffer *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        for (local_3c = 0; local_3c < *(int *)(lVar1 + 0x35c); local_3c = local_3c + 1) {
          aom_wb_write_literal
                    ((aom_write_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          aom_wb_write_literal
                    ((aom_write_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        }
      }
      aom_wb_write_literal
                ((aom_write_bit_buffer *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      aom_wb_write_literal
                ((aom_write_bit_buffer *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      iVar3 = *(int *)(lVar1 + 0x364) * 2 * (*(int *)(lVar1 + 0x364) + 1);
      iVar2 = iVar3;
      if (0 < *(int *)(lVar1 + 0x2b4)) {
        iVar2 = iVar3 + 1;
      }
      if (*(int *)(lVar1 + 0x2b4) != 0) {
        for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + 1) {
          aom_wb_write_literal
                    ((aom_write_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        }
      }
      if ((*(int *)(lVar1 + 0x308) != 0) || (*(int *)(lVar1 + 0x4b8) != 0)) {
        for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < iVar2;
            in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
          aom_wb_write_literal
                    ((aom_write_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        }
      }
      if ((*(int *)(lVar1 + 0x35c) != 0) || (*(int *)(lVar1 + 0x4b8) != 0)) {
        for (in_stack_ffffffffffffffb0 = 0; in_stack_ffffffffffffffb0 < iVar2;
            in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + 1) {
          aom_wb_write_literal
                    ((aom_write_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        }
      }
      aom_wb_write_literal
                ((aom_write_bit_buffer *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      aom_wb_write_literal
                ((aom_write_bit_buffer *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      if (*(int *)(lVar1 + 0x308) != 0) {
        aom_wb_write_literal
                  ((aom_write_bit_buffer *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        aom_wb_write_literal
                  ((aom_write_bit_buffer *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        aom_wb_write_literal
                  ((aom_write_bit_buffer *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      }
      if (*(int *)(lVar1 + 0x35c) != 0) {
        aom_wb_write_literal
                  ((aom_write_bit_buffer *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        aom_wb_write_literal
                  ((aom_write_bit_buffer *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        aom_wb_write_literal
                  ((aom_write_bit_buffer *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      }
      aom_wb_write_bit(in_RSI,*(int *)(lVar1 + 0x4ac));
      aom_wb_write_bit(in_RSI,*(int *)(lVar1 + 0x4b0));
    }
  }
  return;
}

Assistant:

static inline void write_film_grain_params(const AV1_COMP *const cpi,
                                           struct aom_write_bit_buffer *wb) {
  const AV1_COMMON *const cm = &cpi->common;
  const aom_film_grain_t *const pars = &cm->cur_frame->film_grain_params;
  aom_wb_write_bit(wb, pars->apply_grain);
  if (!pars->apply_grain) return;

  aom_wb_write_literal(wb, pars->random_seed, 16);

  if (cm->current_frame.frame_type == INTER_FRAME)
    aom_wb_write_bit(wb, pars->update_parameters);

  if (!pars->update_parameters) {
    int ref_frame, ref_idx;
    for (ref_frame = LAST_FRAME; ref_frame < REF_FRAMES; ref_frame++) {
      ref_idx = get_ref_frame_map_idx(cm, ref_frame);
      assert(ref_idx != INVALID_IDX);
      const RefCntBuffer *const buf = cm->ref_frame_map[ref_idx];
      if (buf->film_grain_params_present &&
          aom_check_grain_params_equiv(pars, &buf->film_grain_params)) {
        break;
      }
    }
    assert(ref_frame < REF_FRAMES);
    aom_wb_write_literal(wb, ref_idx, 3);
    return;
  }

  // Scaling functions parameters
  aom_wb_write_literal(wb, pars->num_y_points, 4);  // max 14
  for (int i = 0; i < pars->num_y_points; i++) {
    aom_wb_write_literal(wb, pars->scaling_points_y[i][0], 8);
    aom_wb_write_literal(wb, pars->scaling_points_y[i][1], 8);
  }

  if (!cm->seq_params->monochrome) {
    aom_wb_write_bit(wb, pars->chroma_scaling_from_luma);
  } else {
    assert(!pars->chroma_scaling_from_luma);
  }

  if (cm->seq_params->monochrome || pars->chroma_scaling_from_luma ||
      ((cm->seq_params->subsampling_x == 1) &&
       (cm->seq_params->subsampling_y == 1) && (pars->num_y_points == 0))) {
    assert(pars->num_cb_points == 0 && pars->num_cr_points == 0);
  } else {
    aom_wb_write_literal(wb, pars->num_cb_points, 4);  // max 10
    for (int i = 0; i < pars->num_cb_points; i++) {
      aom_wb_write_literal(wb, pars->scaling_points_cb[i][0], 8);
      aom_wb_write_literal(wb, pars->scaling_points_cb[i][1], 8);
    }

    aom_wb_write_literal(wb, pars->num_cr_points, 4);  // max 10
    for (int i = 0; i < pars->num_cr_points; i++) {
      aom_wb_write_literal(wb, pars->scaling_points_cr[i][0], 8);
      aom_wb_write_literal(wb, pars->scaling_points_cr[i][1], 8);
    }
  }

  aom_wb_write_literal(wb, pars->scaling_shift - 8, 2);  // 8 + value

  // AR coefficients
  // Only sent if the corresponsing scaling function has
  // more than 0 points

  aom_wb_write_literal(wb, pars->ar_coeff_lag, 2);

  int num_pos_luma = 2 * pars->ar_coeff_lag * (pars->ar_coeff_lag + 1);
  int num_pos_chroma = num_pos_luma;
  if (pars->num_y_points > 0) ++num_pos_chroma;

  if (pars->num_y_points)
    for (int i = 0; i < num_pos_luma; i++)
      aom_wb_write_literal(wb, pars->ar_coeffs_y[i] + 128, 8);

  if (pars->num_cb_points || pars->chroma_scaling_from_luma)
    for (int i = 0; i < num_pos_chroma; i++)
      aom_wb_write_literal(wb, pars->ar_coeffs_cb[i] + 128, 8);

  if (pars->num_cr_points || pars->chroma_scaling_from_luma)
    for (int i = 0; i < num_pos_chroma; i++)
      aom_wb_write_literal(wb, pars->ar_coeffs_cr[i] + 128, 8);

  aom_wb_write_literal(wb, pars->ar_coeff_shift - 6, 2);  // 8 + value

  aom_wb_write_literal(wb, pars->grain_scale_shift, 2);

  if (pars->num_cb_points) {
    aom_wb_write_literal(wb, pars->cb_mult, 8);
    aom_wb_write_literal(wb, pars->cb_luma_mult, 8);
    aom_wb_write_literal(wb, pars->cb_offset, 9);
  }

  if (pars->num_cr_points) {
    aom_wb_write_literal(wb, pars->cr_mult, 8);
    aom_wb_write_literal(wb, pars->cr_luma_mult, 8);
    aom_wb_write_literal(wb, pars->cr_offset, 9);
  }

  aom_wb_write_bit(wb, pars->overlap_flag);

  aom_wb_write_bit(wb, pars->clip_to_restricted_range);
}